

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O1

void __thiscall tchecker::clockbounds::global_m_map_t::~global_m_map_t(global_m_map_t *this)

{
  if (this->_M != (map_t *)0x0) {
    operator_delete__(this->_M);
  }
  this->_clock_nb = 0;
  this->_M = (map_t *)0x0;
  return;
}

Assistant:

global_m_map_t::~global_m_map_t() { clear(); }